

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O2

bool check_dispel(int dis_level,CHAR_DATA *victim,int sn)

{
  bool bVar1;
  AFFECT_DATA *pAVar2;
  
  bVar1 = is_affected(victim,(int)gsn_indom);
  if (bVar1) {
    send_to_char("Your body\'s state is maintained by the force of your will.\n\r",victim);
  }
  else {
    bVar1 = is_affected(victim,sn);
    if (bVar1) {
      pAVar2 = (AFFECT_DATA *)&victim->affected;
      while (pAVar2 = pAVar2->next, pAVar2 != (AFFECT_DATA *)0x0) {
        if (((pAVar2->type == sn) &&
            (bVar1 = saves_dispel(dis_level,(int)pAVar2->level,(int)pAVar2->duration), !bVar1)) &&
           ((pAVar2->bitvector[0] & 0x1000000) == 0)) {
          switchD_00333f01::default(victim,sn);
          bVar1 = str_cmp(skill_table[sn].msg_off,"");
          if (bVar1) {
            send_to_char(skill_table[sn].msg_off,victim);
            send_to_char("\n\r",victim);
          }
          bVar1 = str_cmp(skill_table[sn].room_msg_off,"");
          if (!bVar1) {
            return true;
          }
          act(skill_table[sn].room_msg_off,victim,(void *)0x0,(void *)0x0,0);
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool check_dispel(int dis_level, CHAR_DATA *victim, int sn)
{
	AFFECT_DATA *af;

	if (is_affected(victim, gsn_indom))
	{
		send_to_char("Your body's state is maintained by the force of your will.\n\r", victim);
		return false;
	}

	if (is_affected(victim, sn))
	{
		for (af = victim->affected; af != nullptr; af = af->next)
		{
			if (af->type == sn)
			{
				if (!saves_dispel(dis_level, af->level, af->duration) && !IS_SET(af->bitvector, AFF_PERMANENT))
				{
					affect_strip(victim, sn);

					if (str_cmp(skill_table[sn].msg_off, ""))
					{
						send_to_char(skill_table[sn].msg_off, victim);
						send_to_char("\n\r", victim);
					}

					if (str_cmp(skill_table[sn].room_msg_off, ""))
						act(skill_table[sn].room_msg_off, victim, 0, 0, TO_ROOM);

					return true;
				}
			}
		}
	}

	return false;
}